

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProxyConfig.cpp
# Opt level: O1

bool __thiscall ProxyConfig::initWithFile(ProxyConfig *this,string *configFile)

{
  FILE *__stream;
  ulong uVar1;
  Ch *__ptr;
  bool bVar2;
  EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> is;
  MemoryStream ms;
  EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> local_50;
  MemoryStream local_48;
  
  if (((this->m_isInit == false) && (configFile->_M_string_length != 0)) &&
     (__stream = fopen((configFile->_M_dataplus)._M_p,"rb"), __stream != (FILE *)0x0)) {
    fseek(__stream,0,2);
    uVar1 = ftell(__stream);
    local_48.size_ = uVar1 & 0xffffffff;
    if (local_48.size_ != 0) {
      __ptr = (Ch *)operator_new__((ulong)((int)uVar1 + 1));
      fseek(__stream,0,0);
      fread(__ptr,local_48.size_,1,__stream);
      fclose(__stream);
      local_48.end_ = __ptr + local_48.size_;
      __ptr[local_48.size_] = '\0';
      local_48.src_ = __ptr;
      local_48.begin_ = __ptr;
      rapidjson::EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream>::
      EncodedInputStream(&local_50,&local_48);
      rapidjson::
      GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
      ::
      ParseStream<0u,rapidjson::UTF8<char>,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
                ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
                  *)this,&local_50);
      operator_delete__(__ptr);
      bVar2 = (this->m_document).parseResult_.code_ == kParseErrorNone;
      if (bVar2) {
        this->m_isInit = true;
        return bVar2;
      }
      printf("json parse error: %u");
      return bVar2;
    }
    fclose(__stream);
  }
  return false;
}

Assistant:

bool ProxyConfig::initWithFile(const std::string& configFile)
{
	if (m_isInit)
	{
		return false;
	}
	if (configFile.empty())
	{
		return false;
	}

	FILE* fp = fopen(configFile.c_str(), "rb");
	if (fp == NULL)
	{
		return false;
	}

	fseek(fp, 0, SEEK_END);
	uint32_t fileSize = ftell(fp);

	if (fileSize <= 0)
	{
		fclose(fp);
		return false;
	}

	char* buf = new char[fileSize + 1];
	fseek(fp, 0, SEEK_SET);
	fread(buf, fileSize, 1, fp);
	fclose(fp);

	buf[fileSize] = '\0';

	m_document.Parse(buf, fileSize);
	delete[] buf;

	if (m_document.HasParseError())
	{
		printf("json parse error: %u", m_document.GetParseError());
		return false;
	}
	m_isInit = true;
	return true;
}